

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDFacePtr ON_SubDFace::FromVertices(ON_SubDVertex **vertex_list,size_t vertex_count)

{
  ushort uVar1;
  ON_SubDVertex *pOVar2;
  uint uVar3;
  ON_SubDFace *pOVar4;
  ON_SubDEdgePtr OVar5;
  ON_SubDFace **memblock;
  ON_SubDFacePtr *pOVar6;
  ON_SubDVertex *pOVar7;
  ON_SubDVertex *pOVar8;
  ulong uVar9;
  uint uVar10;
  ON_SubDEdge *this;
  ON_SubDFace *pOVar11;
  uint uVar12;
  ON_SubDFacePtr *pOVar13;
  ON_SubDVertex *pOVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ON_SubDFace *candiates4 [4];
  
  if (vertex_list != (ON_SubDVertex **)0x0 && 0xffffffffffff0011 < vertex_count - 0xfff1) {
    memblock = (ON_SubDFace **)0x0;
    pOVar14 = *vertex_list;
    uVar18 = 0;
    uVar3 = 0;
    do {
      pOVar11 = (ON_SubDFace *)0x0;
      uVar10 = (uint)vertex_count;
      if (uVar3 == uVar10) goto LAB_005d37f6;
      uVar12 = uVar3 + 1;
      pOVar4 = (ON_SubDFace *)(ulong)uVar12;
      if (uVar12 == uVar10) {
        pOVar4 = pOVar11;
      }
      pOVar7 = vertex_list[(long)pOVar4];
      OVar5 = ON_SubDEdge::FromVertices(pOVar14,pOVar7);
      this = (ON_SubDEdge *)(OVar5.m_ptr & 0xfffffffffffffff8);
      if (this == (ON_SubDEdge *)0x0) {
LAB_005d37ee:
        pOVar11 = (ON_SubDFace *)0x0;
        goto LAB_005d37f6;
      }
      uVar1 = this->m_face_count;
      uVar15 = (ulong)uVar1;
      if (uVar15 == 0) goto LAB_005d37ee;
      if (uVar3 == 0) {
        memblock = candiates4;
        if (4 < uVar1) {
          memblock = (ON_SubDFace **)onmalloc((ulong)uVar1 << 3);
          uVar15 = (ulong)this->m_face_count;
        }
        pOVar6 = this->m_face2;
        uVar16 = uVar18;
        for (uVar9 = 0; uVar15 != uVar9; uVar9 = uVar9 + 1) {
          pOVar13 = pOVar6;
          if (1 < uVar9) {
            pOVar13 = this->m_facex + (uVar9 - 2);
          }
          pOVar11 = (ON_SubDFace *)(pOVar13->m_ptr & 0xfffffffffffffff8);
          uVar18 = uVar16;
          if ((pOVar11 != (ON_SubDFace *)0x0) && (pOVar11->m_edge_count == vertex_count)) {
            uVar18 = (ulong)((int)uVar16 + 1);
            memblock[uVar16] = pOVar11;
          }
          pOVar6 = pOVar6 + 1;
          uVar16 = uVar18;
        }
      }
      else {
        uVar16 = 0;
        for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
          pOVar11 = memblock[uVar15];
          uVar3 = ON_SubDEdge::FaceArrayIndex(this,pOVar11);
          uVar9 = uVar16;
          if (uVar3 != 0xffffffff) {
            uVar9 = (ulong)((int)uVar16 + 1);
            memblock[uVar16] = pOVar11;
          }
          uVar16 = uVar9;
        }
      }
      pOVar11 = (ON_SubDFace *)0x0;
      if ((int)uVar16 == 0) goto LAB_005d37f6;
      pOVar14 = pOVar7;
      uVar18 = uVar16;
      uVar3 = uVar12;
    } while ((int)uVar16 != 1);
    pOVar11 = *memblock;
LAB_005d37f6:
    if (memblock != candiates4 && memblock != (ON_SubDFace **)0x0) {
      onfree(memblock);
    }
    if ((pOVar11 != (ON_SubDFace *)0x0) &&
       (uVar3 = VertexIndex(pOVar11,*vertex_list), uVar3 < uVar10)) {
      pOVar14 = vertex_list[1];
      uVar12 = 0;
      if (uVar3 + 1 != uVar10) {
        uVar12 = uVar3 + 1;
      }
      pOVar7 = Vertex(pOVar11,uVar12);
      if (pOVar14 == pOVar7) {
        uVar18 = 2;
        do {
          if (vertex_count <= uVar18) goto LAB_005d38e9;
          pOVar2 = vertex_list[uVar18];
          pOVar8 = Vertex(pOVar11,(uint)((ulong)(uVar3 + (int)uVar18) % (vertex_count & 0xffffffff))
                         );
          uVar18 = uVar18 + 1;
        } while (pOVar2 == pOVar8);
      }
      else {
        uVar10 = uVar10 + uVar3;
        lVar17 = 0;
        do {
          uVar10 = uVar10 - 1;
          if (vertex_count - 1 == lVar17) {
LAB_005d38e9:
            return (ON_SubDFacePtr)((ulong)(pOVar14 != pOVar7) | (ulong)pOVar11);
          }
          pOVar2 = vertex_list[lVar17 + 1];
          pOVar8 = Vertex(pOVar11,(uint)((ulong)uVar10 % (vertex_count & 0xffffffff)));
          lVar17 = lVar17 + 1;
        } while (pOVar2 == pOVar8);
      }
    }
  }
  return (ON_SubDFacePtr)0;
}

Assistant:

const ON_SubDFacePtr ON_SubDFace::FromVertices(const ON_SubDVertex* const* vertex_list, size_t vertex_count)
{
  if (nullptr == vertex_list || vertex_count < 3 || vertex_count > ON_SubDFace::MaximumEdgeCount)
    return ON_SubDFacePtr::Null;

  const ON_SubDFace* candiates4[4];
  const ON_SubDFace** candidates = nullptr;
  unsigned candidate_count = 0;
  const ON_SubDFace* f = nullptr;

  const unsigned unsigned_vertex_count = (unsigned)vertex_count;
  if (unsigned_vertex_count < 3)
    return ON_SubDFacePtr::Null;
  const ON_SubDVertex* v[2] = { nullptr,vertex_list[0] };
  for (unsigned fei = 0; fei < unsigned_vertex_count; ++fei)
  {
    v[0] = v[1];
    v[1] = vertex_list[(fei + 1) % unsigned_vertex_count];
    const ON_SubDEdge* e = ON_SubDEdge::FromVertices(v[0], v[1]).Edge();
    if (nullptr == e || e->m_face_count <= 0)
      candidate_count = 0;
    else if (0 == fei)
    {
      candidates = (e->m_face_count <= 4) ? candiates4 : ((const ON_SubDFace**)onmalloc(e->m_face_count * sizeof(candidates[0])));
      for (unsigned short efi = 0; efi < e->m_face_count; ++efi)
      {
        const ON_SubDFace* ef = e->Face(efi);
        if (nullptr != ef && unsigned_vertex_count == ef->EdgeCount())
          candidates[candidate_count++] = ef;
      }
    }
    else
    {
      unsigned c = 0;
      for (unsigned i = 0; i < candidate_count; ++i)
      {
        if (e->FaceArrayIndex(candidates[i]) < ON_UNSET_UINT_INDEX)
          candidates[c++] = candidates[i];
      }
      candidate_count = c;
    }

    if (0 == candidate_count)
      break;
    if (1 == candidate_count)
    {
      f = candidates[0];
      break;
    }
  }

  if (nullptr != candidates && candidates != candiates4)
    onfree(candidates);

  if (nullptr == f)
    return ON_SubDFacePtr::Null;

  const unsigned fvi0 = f->VertexIndex(vertex_list[0]);
  if (fvi0 >= unsigned_vertex_count)
    return ON_SubDFacePtr::Null;

  const ON__UINT_PTR dir = (vertex_list[1] == f->Vertex((fvi0 + 1) % unsigned_vertex_count)) ? 0 : 1;
  if (0 == dir)
  {
    for (unsigned fvi = 2; fvi < unsigned_vertex_count; fvi++)
    {
      if (vertex_list[fvi] != f->Vertex((fvi0 + fvi) % unsigned_vertex_count))
        return ON_SubDFacePtr::Null;
    }
  }
  else
  {
    for (unsigned fvi = 1; fvi < unsigned_vertex_count; fvi++)
    {
      if (vertex_list[fvi] != f->Vertex((fvi0 + unsigned_vertex_count - fvi) % unsigned_vertex_count))
        return ON_SubDFacePtr::Null;
    }
  }
  return ON_SubDFacePtr::Create(f, dir);
}